

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

string * __thiscall
MetaCommand::GetValueAsString(MetaCommand *this,string *optionName,string *fieldName)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  reference pFVar4;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  const_iterator itField;
  const_iterator it;
  string fieldname;
  vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *in_stack_ffffffffffffff48;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  *in_stack_ffffffffffffff50;
  allocator *paVar5;
  string *__rhs;
  allocator local_7d;
  undefined4 local_7c;
  Field *local_78;
  __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
  local_70;
  Option *local_68;
  Option *local_60;
  __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
  local_58 [3];
  string local_40 [64];
  
  __rhs = in_RDI;
  std::__cxx11::string::string(local_40,in_RCX);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,in_RDX);
  }
  local_60 = (Option *)
             std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::begin
                       ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                        in_stack_ffffffffffffff48);
  __gnu_cxx::
  __normal_iterator<MetaCommand::Option_const*,std::vector<MetaCommand::Option,std::allocator<MetaCommand::Option>>>
  ::__normal_iterator<MetaCommand::Option*>
            ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff50,
             (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
              *)in_stack_ffffffffffffff48);
  do {
    local_68 = (Option *)
               std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::end
                         ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
                          in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      paVar5 = &local_7d;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar5);
      std::allocator<char>::~allocator((allocator<char> *)&local_7d);
LAB_001270f7:
      local_7c = 1;
      std::__cxx11::string::~string(local_40);
      return __rhs;
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator*(local_58);
    _Var2 = std::operator==(in_RSI,__rhs);
    if (_Var2) {
      __gnu_cxx::
      __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
      ::operator*(local_58);
      local_70._M_current =
           (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::begin
                              (in_stack_ffffffffffffff48);
      while( true ) {
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
        ::operator*(local_58);
        local_78 = (Field *)std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::
                            end(in_stack_ffffffffffffff48);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff50,
                           (__normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                            *)in_stack_ffffffffffffff48);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator*(&local_70);
        _Var2 = std::operator==(in_RSI,__rhs);
        if (_Var2) {
          pFVar4 = __gnu_cxx::
                   __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
                   ::operator*(&local_70);
          std::__cxx11::string::string((string *)in_RDI,(string *)&pFVar4->value);
          goto LAB_001270f7;
        }
        __gnu_cxx::
        __normal_iterator<const_MetaCommand::Field_*,_std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>_>
        ::operator++(&local_70);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_MetaCommand::Option_*,_std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>_>
    ::operator++(local_58);
  } while( true );
}

Assistant:

METAIO_STL::string MetaCommand::GetValueAsString(METAIO_STL::string optionName,
                                          METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return (*itField).value;
          }
        ++itField;
        }
      }
    ++it;
    }
  return "";
}